

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_cost_test.cc
# Opt level: O2

void anon_unknown.dwarf_1b432f9::TestMvComponentCostTable(MvSubpelPrecision precision)

{
  __uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true> _Var1;
  __uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true> _Var2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  int *piVar6;
  aom_cdf_prob *cdf;
  ulong uVar7;
  SEARCH_METHODS *pSVar8;
  int iVar9;
  uint uVar10;
  int (*paiVar11) [4];
  uint uVar12;
  int *lhs;
  int *mvcost;
  long lVar13;
  ulong uVar14;
  int *rhs;
  unique_ptr<int[],_std::default_delete<int[]>_> mvcost_buf;
  unique_ptr<int[],_std::default_delete<int[]>_> mvcost_ref_buf;
  int sign_cost [2];
  int class0_fp_cost [2] [4];
  int class_cost [11];
  int local_b0 [2];
  int class0_hp_cost [2];
  int class0_cost [2];
  int bits_cost [10] [2];
  int fp_cost [4];
  
  _Var1.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)operator_new__(0x1fffc);
  mvcost_ref_buf._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                 (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                 _Var1.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
  _Var2.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)operator_new__(0x1fffc);
  mvcost_buf._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                 (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                 _Var2.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
  av1_cost_tokens_from_cdf
            (sign_cost,(aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + 0x36),
             (int *)0x0);
  av1_cost_tokens_from_cdf
            (class_cost,(aom_cdf_prob *)(anonymous_namespace)::kTestComponentContext,(int *)0x0);
  av1_cost_tokens_from_cdf
            (class0_cost,(aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + 0x48),
             (int *)0x0);
  lhs = (int *)((long)_Var1.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                      super__Head_base<0UL,_int_*,_false>._M_head_impl + 0xfffc);
  mvcost = (int *)((long)_Var2.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                         super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                         super__Head_base<0UL,_int_*,_false>._M_head_impl + 0xfffc);
  cdf = (aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + 0x4e);
  for (lVar13 = 0; lVar13 != 0x50; lVar13 = lVar13 + 8) {
    av1_cost_tokens_from_cdf((int *)((long)bits_cost[0] + lVar13),cdf,(int *)0x0);
    cdf = cdf + 3;
  }
  av1_cost_tokens_from_cdf
            (class0_fp_cost[0],(aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + 0x18)
             ,(int *)0x0);
  av1_cost_tokens_from_cdf
            (class0_fp_cost[1],(aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + 0x22)
             ,(int *)0x0);
  av1_cost_tokens_from_cdf
            (fp_cost,(aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + 0x2c),
             (int *)0x0);
  if ('\0' < precision) {
    av1_cost_tokens_from_cdf
              (class0_hp_cost,(aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + 0x3c),
               (int *)0x0);
    av1_cost_tokens_from_cdf
              (local_b0,(aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + 0x42),
               (int *)0x0);
  }
  *lhs = 0;
  for (uVar7 = 1; uVar7 != 0x4000; uVar7 = uVar7 + 1) {
    uVar12 = (int)uVar7 - 1;
    uVar4 = 0x1f;
    if ((int)uVar12 >> 3 != 0) {
      for (; (uint)((int)uVar12 >> 3) >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    if (uVar7 < 9) {
      uVar4 = 0;
    }
    bVar3 = (byte)uVar4;
    iVar9 = -8 << (bVar3 & 0x1f);
    if (bVar3 == 0) {
      iVar9 = 0;
    }
    uVar10 = iVar9 + (int)uVar7 + -1 >> 3;
    uVar14 = (ulong)(uVar4 & 0xff);
    iVar9 = class_cost[uVar14];
    if (bVar3 == 0) {
      iVar9 = iVar9 + class0_cost[(int)uVar10];
    }
    else {
      for (uVar5 = 0; uVar14 != uVar5; uVar5 = uVar5 + 1) {
        iVar9 = iVar9 + bits_cost[uVar5][(uVar10 >> ((uint)uVar5 & 0x1f) & 1) != 0];
      }
    }
    if (-1 < precision) {
      paiVar11 = class0_fp_cost + (int)uVar10;
      if (uVar14 != 0) {
        paiVar11 = &fp_cost;
      }
      iVar9 = iVar9 + (*paiVar11)[uVar12 >> 1 & 3];
      if ('\0' < precision) {
        piVar6 = local_b0;
        if (uVar14 == 0) {
          piVar6 = class0_hp_cost;
        }
        iVar9 = iVar9 + piVar6[uVar12 & 1];
      }
    }
    lhs[uVar7] = iVar9 + sign_cost[0];
    lhs[-uVar7] = iVar9 + sign_cost[1];
  }
  av1_build_nmv_component_cost_table
            (mvcost,(nmv_component *)(anonymous_namespace)::kTestComponentContext,precision);
  lVar13 = 0;
  piVar6 = lhs;
  rhs = mvcost;
  do {
    if (lVar13 == 0x4000) {
LAB_006baa2f:
      std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr(&mvcost_buf);
      std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr(&mvcost_ref_buf);
      return;
    }
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)bits_cost,"mvcost_ref[v]","mvcost[v]",lhs,mvcost);
    if ((char)bits_cost[0][0] == '\0') {
      testing::Message::Message((Message *)class_cost);
      std::operator<<((ostream *)(class_cost._0_8_ + 0x10),"v = ");
      std::ostream::operator<<((void *)(class_cost._0_8_ + 0x10),(int)lVar13);
      if (bits_cost[1] == (int  [2])0x0) {
        pSVar8 = "";
      }
      else {
        pSVar8 = *(SEARCH_METHODS **)bits_cost[1];
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)class0_fp_cost,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/mv_cost_test.cc"
                 ,0x6c,(char *)pSVar8);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)class0_fp_cost,(Message *)class_cost);
LAB_006baa08:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)class0_fp_cost);
      if (class_cost._0_8_ != 0) {
        (**(code **)(*(long *)class_cost._0_8_ + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(bits_cost + 1));
      goto LAB_006baa2f;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(bits_cost + 1));
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)bits_cost,"mvcost_ref[-v]","mvcost[-v]",piVar6,rhs);
    if ((char)bits_cost[0][0] == '\0') {
      testing::Message::Message((Message *)class_cost);
      std::operator<<((ostream *)(class_cost._0_8_ + 0x10),"v = ");
      std::ostream::operator<<((void *)(class_cost._0_8_ + 0x10),(int)lVar13);
      if (bits_cost[1] == (int  [2])0x0) {
        pSVar8 = "";
      }
      else {
        pSVar8 = *(SEARCH_METHODS **)bits_cost[1];
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)class0_fp_cost,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/mv_cost_test.cc"
                 ,0x6d,(char *)pSVar8);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)class0_fp_cost,(Message *)class_cost);
      goto LAB_006baa08;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(bits_cost + 1));
    lVar13 = lVar13 + 1;
    mvcost = mvcost + 1;
    lhs = lhs + 1;
    piVar6 = piVar6 + -1;
    rhs = rhs + -1;
  } while( true );
}

Assistant:

void TestMvComponentCostTable(MvSubpelPrecision precision) {
  std::unique_ptr<int[]> mvcost_ref_buf(new int[MV_VALS]);
  std::unique_ptr<int[]> mvcost_buf(new int[MV_VALS]);
  int *mvcost_ref = mvcost_ref_buf.get() + MV_MAX;
  int *mvcost = mvcost_buf.get() + MV_MAX;

  ReferenceBuildNmvComponentCostTable(mvcost_ref, &kTestComponentContext,
                                      precision);
  av1_build_nmv_component_cost_table(mvcost, &kTestComponentContext, precision);

  for (int v = 0; v <= MV_MAX; ++v) {
    ASSERT_EQ(mvcost_ref[v], mvcost[v]) << "v = " << v;
    ASSERT_EQ(mvcost_ref[-v], mvcost[-v]) << "v = " << v;
  }
}